

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigNumber.cpp
# Opt level: O3

BigNumber * operator-(BigNumber *__return_storage_ptr__,BigNumber *nb1,BigNumber *nb2)

{
  uint *__args;
  uint uVar1;
  bool bVar2;
  pointer puVar3;
  pointer puVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  iterator iVar10;
  uint uVar11;
  int iVar12;
  long lVar13;
  undefined8 local_58;
  pointer *local_50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  BigNumber::BigNumber(__return_storage_ptr__,&local_48,nb2->m_base);
  if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  bVar2 = operator>(nb1,nb2);
  if (bVar2) {
    puVar3 = (nb1->super_Polynome).m_coef.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar5 = (long)(nb1->super_Polynome).m_coef.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)puVar3;
    uVar6 = (long)uVar5 >> 2;
    puVar4 = (nb2->super_Polynome).m_coef.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar8 = (long)(nb2->super_Polynome).m_coef.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)puVar4;
    uVar9 = (long)uVar8 >> 2;
    if ((long)(uVar5 | uVar8) >> 2 != 0) {
      local_50 = &(__return_storage_ptr__->super_Polynome).m_coef.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
      uVar5 = 0;
      uVar7 = 1;
      lVar13 = 0;
      do {
        if (uVar5 < uVar6) {
          __args = puVar3 + uVar5;
          iVar12 = (int)lVar13;
          if (uVar5 < uVar9) {
            uVar11 = puVar3[uVar5];
            uVar1 = puVar4[uVar5];
            if (uVar11 < uVar1) {
              local_58 = nb1->m_base - (lVar13 + (ulong)uVar1);
              iVar10._M_current =
                   (__return_storage_ptr__->super_Polynome).m_coef.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar10._M_current ==
                  (__return_storage_ptr__->super_Polynome).m_coef.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                _M_realloc_insert<unsigned_long>
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                           __return_storage_ptr__,iVar10,&local_58);
                puVar3 = (nb1->super_Polynome).m_coef.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start;
              }
              else {
                *iVar10._M_current = (uint)local_58;
                (__return_storage_ptr__->super_Polynome).m_coef.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish = iVar10._M_current + 1;
              }
              puVar4 = (__return_storage_ptr__->super_Polynome).m_coef.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start + uVar5;
              *puVar4 = *puVar4 + puVar3[uVar5];
            }
            else {
              if ((iVar12 == 0) || (nb2->m_base - (ulong)uVar1 != 1)) {
                if (uVar11 != uVar1) {
                  uVar11 = uVar11 - (iVar12 + uVar1);
                  local_58 = CONCAT44(local_58._4_4_,uVar11);
                  iVar10._M_current =
                       (__return_storage_ptr__->super_Polynome).m_coef.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish;
                  if (iVar10._M_current ==
                      (__return_storage_ptr__->super_Polynome).m_coef.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                    _M_realloc_insert<unsigned_int>
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                               __return_storage_ptr__,iVar10,(uint *)&local_58);
                    goto LAB_001038f2;
                  }
                  *iVar10._M_current = uVar11;
                  goto LAB_001038ea;
                }
                if (uVar11 == 0) {
                  local_58 = (ulong)local_58._4_4_ << 0x20;
                  iVar10._M_current =
                       (__return_storage_ptr__->super_Polynome).m_coef.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish;
                  if (iVar10._M_current !=
                      (__return_storage_ptr__->super_Polynome).m_coef.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    *iVar10._M_current = 0;
                    goto LAB_001039f6;
                  }
                  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<int>
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                             __return_storage_ptr__,iVar10,(int *)&local_58);
                }
                else {
                  local_58 = (nb1->m_base - 1) * lVar13;
                  iVar10._M_current =
                       (__return_storage_ptr__->super_Polynome).m_coef.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish;
                  if (iVar10._M_current ==
                      (__return_storage_ptr__->super_Polynome).m_coef.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                    _M_realloc_insert<unsigned_long>
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                               __return_storage_ptr__,iVar10,&local_58);
                  }
                  else {
                    *iVar10._M_current = (uint)local_58;
LAB_001039f6:
                    (__return_storage_ptr__->super_Polynome).m_coef.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish = iVar10._M_current + 1;
                  }
                }
                goto LAB_00103972;
              }
              iVar10._M_current =
                   (__return_storage_ptr__->super_Polynome).m_coef.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar10._M_current ==
                  (__return_storage_ptr__->super_Polynome).m_coef.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                lVar13 = 1;
                std::vector<unsigned_int,std::allocator<unsigned_int>>::
                _M_realloc_insert<unsigned_int&>
                          ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                           __return_storage_ptr__,iVar10,__args);
                goto LAB_00103972;
              }
              *iVar10._M_current = uVar11;
LAB_00103949:
              (__return_storage_ptr__->super_Polynome).m_coef.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar10._M_current + 1;
            }
LAB_0010396c:
            lVar13 = 1;
          }
          else {
            if (iVar12 == 0) {
              iVar10._M_current =
                   (__return_storage_ptr__->super_Polynome).m_coef.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar10._M_current ==
                  (__return_storage_ptr__->super_Polynome).m_coef.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                lVar13 = 0;
                std::vector<unsigned_int,std::allocator<unsigned_int>>::
                _M_realloc_insert<unsigned_int&>
                          ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                           __return_storage_ptr__,iVar10,__args);
                goto LAB_00103972;
              }
              uVar11 = *__args;
LAB_001038e8:
              *iVar10._M_current = uVar11;
LAB_001038ea:
              (__return_storage_ptr__->super_Polynome).m_coef.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar10._M_current + 1;
            }
            else {
              if (*__args == 0) {
                local_58 = nb1->m_base - 1;
                iVar10._M_current =
                     (__return_storage_ptr__->super_Polynome).m_coef.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar10._M_current !=
                    (__return_storage_ptr__->super_Polynome).m_coef.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  *iVar10._M_current = (uint)local_58;
                  goto LAB_00103949;
                }
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                _M_realloc_insert<unsigned_long>
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                           __return_storage_ptr__,iVar10,&local_58);
                goto LAB_0010396c;
              }
              uVar11 = *__args - 1;
              local_58 = CONCAT44(local_58._4_4_,uVar11);
              iVar10._M_current =
                   (__return_storage_ptr__->super_Polynome).m_coef.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar10._M_current !=
                  (__return_storage_ptr__->super_Polynome).m_coef.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) goto LAB_001038e8;
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         __return_storage_ptr__,iVar10,(uint *)&local_58);
            }
LAB_001038f2:
            lVar13 = 0;
          }
        }
LAB_00103972:
        puVar3 = (nb1->super_Polynome).m_coef.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar6 = (long)(nb1->super_Polynome).m_coef.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar3 >> 2;
        puVar4 = (nb2->super_Polynome).m_coef.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar9 = (long)(nb2->super_Polynome).m_coef.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar4 >> 2;
        uVar8 = uVar9;
        if (uVar9 < uVar6) {
          uVar8 = uVar6;
        }
        uVar5 = (ulong)uVar7;
        uVar7 = uVar7 + 1;
      } while (uVar5 < uVar8);
    }
    BigNumber::m_format(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

BigNumber operator - (BigNumber nb1, BigNumber nb2) {
    /*
     * TODO : A refaire ^^
     */
//    clock_t t1, t2;
//    static clock_t t_tmp;
//    static unsigned int cmp = 0;
//    t1 = clock();
    BigNumber tmp ({}, nb2.m_base);
    int retenue = 0;
    if(nb1 > nb2) {
        for (unsigned int i = 0; i < max(nb1.m_coef.size(), nb2.m_coef.size()); i++) {
            if (i < nb1.m_coef.size() && i < nb2.m_coef.size()) {
                if (nb1.m_coef[i] >= nb2.m_coef[i]) {
                    if (retenue && nb2.m_base - nb2.m_coef[i] == 1) {
                        tmp.m_coef.emplace_back(nb1.m_coef[i]);
                        retenue = 1;
                    } else {
                        if (nb1.m_coef[i] != nb2.m_coef[i]) {
                            tmp.m_coef.emplace_back(nb1.m_coef[i] - nb2.m_coef[i] - retenue);
                            retenue = 0;
                        } else if (nb1.m_coef[i] == 0) {
                            tmp.m_coef.emplace_back(0);
                        } else {
                            tmp.m_coef.emplace_back(nb1.m_base * retenue - retenue);
                        }

                    }

                } else {
                    tmp.m_coef.emplace_back(nb1.m_base - nb2.m_coef[i] - retenue);
                    tmp.m_coef[i] += nb1.m_coef[i];
                    retenue = 1;
                }
            } else if (i < nb1.m_coef.size()) {
                if (retenue == 0) {
                    tmp.m_coef.emplace_back(nb1.m_coef[i]);
                } else {
                    if (nb1.m_coef[i] == 0) {
                        tmp.m_coef.emplace_back(nb1.m_base - 1);
                    } else {
                        tmp.m_coef.emplace_back(nb1.m_coef[i] - 1);
                        retenue = 0;
                    }
                }

            }
        }
        tmp.m_format();
    }


//    t2 = clock();
//    t_tmp += (t2 - t1);
//    cmp += 1;
//    cout << " Soustraction : " << t_tmp << endl;
    return tmp;
}